

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<false,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort type_card;
  uint32_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  FieldEntry *pFVar6;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar7;
  MessageLite *msg_00;
  ushort *p;
  ulong uVar8;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar9;
  uint *puVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar11;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  ParseContext *ctx_00;
  int iVar12;
  uint32_t uVar13;
  RepeatedPtrFieldBase *out;
  uint32_t next_tag;
  undefined1 local_6c [20];
  uint64_t local_58;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_50;
  LogMessageFatal local_48;
  RepeatedPtrFieldBase *local_38;
  
  local_6c._4_8_ = table;
  local_50 = data.field_0;
  pFVar6 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  type_card = pFVar6->type_card;
  local_48.super_LogMessage.errno_saver_.saved_errno_ = type_card & 0x30;
  local_6c._0_2_ = 0x20;
  failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<int,unsigned_short>
                          ((int *)&local_48,(unsigned_short *)local_6c,
                           "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                          );
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    local_48.super_LogMessage.errno_saver_.saved_errno_ = type_card & 0x1c0;
    local_6c._0_2_ = 0x40;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<int,unsigned_short>
                            ((int *)&local_48,(unsigned_short *)local_6c,
                             "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepGroup)"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      if (((uint)local_50.data & 7) == 3) {
        local_6c._12_8_ = msg;
        local_58 = hasbits;
        local_38 = RefAt<google::protobuf::internal::RepeatedPtrFieldBase>
                             (msg,(ulong)pFVar6->offset);
        aVar7 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                GetTableFromAux(type_card,
                                *(FieldAux *)
                                 ((long)(uint16_t *)local_6c._4_8_ +
                                 (ulong)pFVar6->aux_idx * 8 +
                                 (ulong)*(uint32_t *)(local_6c._4_8_ + 0x18)));
        do {
          out = local_38;
          msg_00 = AddMessage((TcParseTableBase *)aVar7,local_38);
          uVar5 = ctx->depth_;
          aVar11.data._4_4_ = 0;
          aVar11.data._0_4_ = uVar5;
          ctx->depth_ = uVar5 - 1;
          ctx_00 = extraout_RDX;
          if ((int)uVar5 < 1) {
LAB_0037b616:
            pcVar9 = Error((MessageLite *)local_6c._12_8_,(char *)out,ctx_00,(TcFieldData)aVar11,
                           (TcParseTableBase *)local_6c._4_8_,local_58);
            return pcVar9;
          }
          iVar12 = ctx->group_depth_ + 1;
          ctx->group_depth_ = iVar12;
          aVar11 = aVar7;
          p = (ushort *)ParseLoopPreserveNone(msg_00,ptr,ctx,(TcParseTableBase *)aVar7);
          ctx_00 = extraout_RDX_00;
          out = (RepeatedPtrFieldBase *)ptr;
          if (p != (ushort *)0x0) {
            failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                                    (uVar5 - 1,ctx->depth_,"old_depth == depth_");
            if (failure_msg != (Nullable<const_char_*>)0x0) {
              pcVar9 = 
              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
              ;
              iVar12 = 0x491;
              goto LAB_0037b695;
            }
            out = (RepeatedPtrFieldBase *)(ulong)(uint)ctx->group_depth_;
            failure_msg = absl::lts_20250127::log_internal::Check_EQImpl
                                    (iVar12,ctx->group_depth_,"old_group_depth == group_depth_");
            ctx_00 = extraout_RDX_01;
            if (failure_msg != (Nullable<const_char_*>)0x0) {
              pcVar9 = 
              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
              ;
              iVar12 = 0x492;
              goto LAB_0037b695;
            }
          }
          uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          uVar1 = ctx->depth_;
          uVar2 = ctx->group_depth_;
          ctx->depth_ = uVar1 + 1;
          ctx->group_depth_ = uVar2 + -1;
          if ((p == (ushort *)0x0) || (uVar13 = (uint32_t)local_50.data, uVar3 != uVar13))
          goto LAB_0037b616;
          if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_0037b638;
          out = (RepeatedPtrFieldBase *)local_6c;
          ptr = ReadTag((char *)p,(uint32_t *)out,0);
          ctx_00 = extraout_RDX_02;
          if ((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) goto LAB_0037b616;
        } while (local_6c._0_4_ == uVar13);
        if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) {
LAB_0037b638:
          uVar4 = local_58;
          if (*(uint16_t *)local_6c._4_8_ != 0) {
            puVar10 = RefAt<unsigned_int>((void *)local_6c._12_8_,(ulong)*(uint16_t *)local_6c._4_8_
                                         );
            *puVar10 = *puVar10 | (uint)uVar4;
          }
          return (char *)p;
        }
        uVar5 = (uint)*(uint8_t *)(local_6c._4_8_ + 8) & (uint)*p;
        if ((uVar5 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar8 = (ulong)(uVar5 & 0xfffffff8);
        UNRECOVERED_JUMPTABLE =
             *(TailCallParseFunc *)
              (&((TcParseTableBase *)(local_6c._4_8_ + 0x38))->has_bits_offset + uVar8);
        aVar7.data = (ulong)*p ^
                     *(ulong *)(&((TcParseTableBase *)(local_6c._4_8_ + 0x38))->fast_idx_mask +
                               uVar8 * 2);
        ptr = (char *)p;
        msg = (MessageLite *)local_6c._12_8_;
        hasbits = local_58;
      }
      else {
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(local_6c._4_8_ + 0x30);
        aVar7 = local_50;
      }
      pcVar9 = (*UNRECOVERED_JUMPTABLE)
                         (msg,ptr,ctx,(TcFieldData)aVar7.data,(TcParseTableBase *)local_6c._4_8_,
                          hasbits);
      return pcVar9;
    }
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
    ;
    iVar12 = 0xa25;
  }
  else {
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
    ;
    iVar12 = 0xa18;
  }
LAB_0037b695:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_48,pcVar9,iVar12,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_48);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}